

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64
drwav_read_pcm_frames_s32__ieee(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint32 dVar1;
  drwav_uint64 dVar2;
  drwav_int32 *in_RSI;
  drwav *in_RDI;
  drwav_uint64 framesRead;
  drwav_uint32 bytesPerFrame;
  drwav_uint8 sampleData [4096];
  drwav_uint64 totalFramesRead;
  void *in_stack_ffffffffffffefa8;
  drwav_int32 *framesToRead_00;
  drwav *pIn;
  drwav_int32 *pOut;
  drwav_uint64 local_28;
  drwav_int32 *local_18;
  drwav_uint64 local_8;
  
  dVar1 = drwav_get_bytes_per_pcm_frame(in_RDI);
  if (dVar1 == 0) {
    local_8 = 0;
  }
  else {
    local_28 = 0;
    for (local_18 = in_RSI; local_18 != (drwav_int32 *)0x0;
        local_18 = (drwav_int32 *)((long)local_18 - dVar2)) {
      framesToRead_00 = local_18;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(dVar1),0) <= local_18) {
        framesToRead_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(dVar1),0);
      }
      pIn = in_RDI;
      pOut = local_18;
      dVar2 = drwav_read_pcm_frames(in_RDI,(drwav_uint64)framesToRead_00,in_stack_ffffffffffffefa8);
      if (dVar2 == 0) break;
      in_stack_ffffffffffffefa8 = (void *)(dVar2 * in_RDI->channels);
      drwav__ieee_to_s32(pOut,(drwav_uint8 *)pIn,(size_t)framesToRead_00,
                         (uint)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
      local_28 = dVar2 + local_28;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static drwav_uint64 drwav_read_pcm_frames_s32__ieee(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    drwav_uint64 totalFramesRead;
    drwav_uint8 sampleData[4096];

    drwav_uint32 bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    totalFramesRead = 0;

    while (framesToRead > 0) {
        drwav_uint64 framesRead = drwav_read_pcm_frames(pWav, drwav_min(framesToRead, sizeof(sampleData)/bytesPerFrame), sampleData);
        if (framesRead == 0) {
            break;
        }

        drwav__ieee_to_s32(pBufferOut, sampleData, (size_t)(framesRead*pWav->channels), bytesPerFrame/pWav->channels);

        pBufferOut      += framesRead*pWav->channels;
        framesToRead    -= framesRead;
        totalFramesRead += framesRead;
    }

    return totalFramesRead;
}